

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O3

void uavs3d_if_ver_luma(pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff,
                       int max_val)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  pel *ppVar5;
  long lVar6;
  ulong uVar7;
  pel *ppVar8;
  long lVar9;
  pel *ppVar10;
  pel *ppVar11;
  
  if (0 < height) {
    lVar3 = (long)i_src;
    ppVar5 = src + (i_src << 2);
    ppVar10 = src + i_src * 3;
    ppVar11 = src + i_src * 2;
    ppVar8 = src + lVar3;
    lVar9 = (long)src - lVar3;
    lVar4 = (long)src - (long)(i_src * 2);
    lVar6 = (long)src - (long)(i_src * 3);
    iVar2 = 0;
    do {
      if (0 < width) {
        uVar7 = 0;
        do {
          iVar1 = (int)((int)coeff[7] * (uint)ppVar5[uVar7] +
                        (int)coeff[6] * (uint)ppVar10[uVar7] +
                        (int)coeff[5] * (uint)ppVar11[uVar7] + (int)coeff[4] * (uint)ppVar8[uVar7] +
                        (int)coeff[3] * (uint)src[uVar7] +
                        (int)coeff[2] * (uint)*(byte *)(lVar9 + uVar7) +
                        (int)coeff[1] * (uint)*(byte *)(lVar4 + uVar7) +
                        (int)*coeff * (uint)*(byte *)(lVar6 + uVar7) + 0x20) >> 6;
          if (max_val <= iVar1) {
            iVar1 = max_val;
          }
          if (iVar1 < 1) {
            iVar1 = 0;
          }
          dst[uVar7] = (pel)iVar1;
          uVar7 = uVar7 + 1;
        } while ((uint)width != uVar7);
      }
      src = src + lVar3;
      dst = dst + i_dst;
      iVar2 = iVar2 + 1;
      ppVar5 = ppVar5 + lVar3;
      ppVar10 = ppVar10 + lVar3;
      ppVar11 = ppVar11 + lVar3;
      ppVar8 = ppVar8 + lVar3;
      lVar9 = lVar9 + lVar3;
      lVar4 = lVar4 + lVar3;
      lVar6 = lVar6 + lVar3;
    } while (iVar2 != height);
  }
  return;
}

Assistant:

static void uavs3d_if_ver_luma(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, s8 const *coeff, int max_val)
{
    int row, col;
    int sum, val;

    for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
            sum = FLT_8TAP_VER(src, col, i_src, coeff);
            val = (sum + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, val);
        }
        src += i_src;
        dst += i_dst;
    }
}